

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O0

void __thiscall docopt::LeafPattern::setValue(LeafPattern *this,value *v)

{
  value *v_local;
  LeafPattern *this_local;
  
  value::operator=(&this->fValue,v);
  return;
}

Assistant:

void setValue(value&& v) { fValue = std::move(v); }